

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device_00;
  float local_74;
  float local_6c;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  size_t number_of_faulty_devices;
  size_t number_of_devices;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LIST_ITEM_HANDLE pLStack_28;
  RETRY_ACTION retry_action;
  LIST_ITEM_HANDLE list_item;
  AMQP_TRANSPORT_INSTANCE *transport_instance;
  LOGGER_LOG l;
  TRANSPORT_LL_HANDLE handle_local;
  
  l = (LOGGER_LOG)handle;
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    transport_instance = (AMQP_TRANSPORT_INSTANCE *)xlogging_get_log_function();
    if (transport_instance != (AMQP_TRANSPORT_INSTANCE *)0x0) {
      (*(code *)transport_instance)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_DoWork",0x58f,1,
                 "IoTHubClient DoWork failed: transport handle parameter is NULL.");
    }
  }
  else if (*(int *)((long)handle + 0x40) != 7) {
    list_item = (LIST_ITEM_HANDLE)handle;
    if (*(int *)((long)handle + 0x40) == 4) {
      iVar1 = retry_control_should_retry
                        (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x48),
                         (RETRY_ACTION *)((long)&l_1 + 4));
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_DoWork",0x5a0,1,
                    "retry_control_should_retry() failed; assuming immediate connection retry for safety."
                   );
        }
        l_1._4_4_ = 0;
      }
      if (l_1._4_4_ == 0) {
        prepare_for_connection_retry((AMQP_TRANSPORT_INSTANCE *)list_item);
      }
      else if (l_1._4_4_ == 2) {
        update_state((AMQP_TRANSPORT_INSTANCE *)list_item,
                     AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES);
        singlylinkedlist_foreach
                  ((SINGLYLINKEDLIST_HANDLE)list_item[2].next,
                   raise_connection_status_callback_retry_expired,(void *)0x0);
      }
    }
    else {
      pLStack_28 = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28))
      ;
      if (pLStack_28 != (LIST_ITEM_HANDLE)0x0) {
        if ((list_item[1].next == (void *)0x0) &&
           (iVar1 = establish_amqp_connection((AMQP_TRANSPORT_INSTANCE *)list_item), iVar1 != 0)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                      ,"IoTHubTransport_AMQP_Common_DoWork",0x5b8,1,
                      "AMQP transport failed to establish connection with service.");
          }
          update_state((AMQP_TRANSPORT_INSTANCE *)list_item,
                       AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
        }
        else if (*(int *)&list_item[2].item == 1) {
          number_of_faulty_devices = 0;
          registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE *)0x0;
          while (pLStack_28 != (LIST_ITEM_HANDLE)0x0) {
            registered_device_00 =
                 (AMQP_TRANSPORT_DEVICE_INSTANCE *)singlylinkedlist_item_get_value(pLStack_28);
            if (registered_device_00 == (AMQP_TRANSPORT_DEVICE_INSTANCE *)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                          ,"IoTHubTransport_AMQP_Common_DoWork",0x5c7,1,
                          "Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)"
                         );
              }
            }
            else if (registered_device_00->number_of_send_event_complete_failures < 5) {
              iVar1 = IoTHubTransport_AMQP_Common_Device_DoWork(registered_device_00);
              if ((iVar1 != 0) && (4 < registered_device_00->number_of_previous_failures)) {
                registered_device =
                     (AMQP_TRANSPORT_DEVICE_INSTANCE *)((long)&registered_device->device_id + 1);
              }
            }
            else {
              registered_device =
                   (AMQP_TRANSPORT_DEVICE_INSTANCE *)((long)&registered_device->device_id + 1);
            }
            pLStack_28 = singlylinkedlist_get_next_item(pLStack_28);
            number_of_faulty_devices = number_of_faulty_devices + 1;
          }
          if (registered_device != (AMQP_TRANSPORT_DEVICE_INSTANCE *)0x0) {
            local_6c = (float)registered_device;
            local_74 = (float)number_of_faulty_devices;
            if (0.0 <= local_6c / local_74) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                          ,"IoTHubTransport_AMQP_Common_DoWork",0x5dc,1,
                          "Reconnection required. %zd of %zd registered devices are failing.",
                          registered_device,number_of_faulty_devices);
              }
              update_state((AMQP_TRANSPORT_INSTANCE *)list_item,
                           AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
            }
          }
        }
      }
      if (list_item[1].next != (void *)0x0) {
        amqp_connection_do_work((AMQP_CONNECTION_HANDLE)list_item[1].next);
      }
    }
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("IoTHubClient DoWork failed: transport handle parameter is NULL.");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport_instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        LIST_ITEM_HANDLE list_item;

        if (transport_instance->state == AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES)
        {
            // Nothing to be done.
        }
        else if (transport_instance->state == AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED)
        {
            RETRY_ACTION retry_action;

            if (retry_control_should_retry(transport_instance->connection_retry_control, &retry_action) != RESULT_OK)
            {
                LogError("retry_control_should_retry() failed; assuming immediate connection retry for safety.");
                retry_action = RETRY_ACTION_RETRY_NOW;
            }

            if (retry_action == RETRY_ACTION_RETRY_NOW)
            {
                prepare_for_connection_retry(transport_instance);
            }
            else if (retry_action == RETRY_ACTION_STOP_RETRYING)
            {
                update_state(transport_instance, AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES);

                (void)singlylinkedlist_foreach(transport_instance->registered_devices, raise_connection_status_callback_retry_expired, NULL);
            }
        }
        else
        {
            if ((list_item = singlylinkedlist_get_head_item(transport_instance->registered_devices)) != NULL)
            {
                // We need to check if there are devices, otherwise the amqp_connection won't be able to be created since
                // there is not a preferred authentication mode set yet on the transport.

                if (transport_instance->amqp_connection == NULL && establish_amqp_connection(transport_instance) != RESULT_OK)
                {
                    LogError("AMQP transport failed to establish connection with service.");

                    update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                }
                else if (transport_instance->amqp_connection_state == AMQP_CONNECTION_STATE_OPENED)
                {
                    size_t number_of_devices = 0;
                    size_t number_of_faulty_devices = 0;

                    while (list_item != NULL)
                    {
                        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                        if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                        {
                            LogError("Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)");
                        }
                        else if (registered_device->number_of_send_event_complete_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                        {
                            number_of_faulty_devices++;
                        }
                        else if (IoTHubTransport_AMQP_Common_Device_DoWork(registered_device) != RESULT_OK)
                        {
                            if (registered_device->number_of_previous_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                            {
                                number_of_faulty_devices++;
                            }
                        }

                        list_item = singlylinkedlist_get_next_item(list_item);
                        number_of_devices++;
                    }

                    if (number_of_faulty_devices > 0 &&
                        ((float)number_of_faulty_devices/(float)number_of_devices) >= DEVICE_MULTIPLEXING_FAULTY_DEVICE_RATIO_RECONNECTION_THRESHOLD)
                    {
                        LogError("Reconnection required. %zd of %zd registered devices are failing.", number_of_faulty_devices, number_of_devices);

                        update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                    }
                }
            }

            if (transport_instance->amqp_connection != NULL)
            {
                amqp_connection_do_work(transport_instance->amqp_connection);
            }
        }
    }
}